

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::TextureFilterMinmaxUtils(TextureFilterMinmaxUtils *this)

{
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  *this_00;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  *this_01;
  pointer *ppSVar1;
  iterator iVar2;
  ReductionModeParam RVar3;
  Texture1D *local_38;
  int local_30;
  
  this_00 = &this->m_supportedTextureDataTypes;
  this_01 = &this->m_supportedTextureTypes;
  (this->m_supportedTextureTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_supportedTextureTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_supportedTextureDataTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_supportedTextureDataTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_reductionModeParams).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_supportedTextureDataTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_reductionModeParams).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_reductionModeParams).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_supportedTextureTypes).
  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._0_5_ = 0x8007;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>
            (&this->m_reductionModeParams,(ReductionModeParam *)&local_38);
  local_38._0_5_ = 0x9367;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>
            (&this->m_reductionModeParams,(ReductionModeParam *)&local_38);
  local_38 = (Texture1D *)CONCAT35(local_38._5_3_,0x8008);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>
            (&this->m_reductionModeParams,(ReductionModeParam *)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  Texture1D::Texture1D((Texture1D *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  Texture1DArray::Texture1DArray((Texture1DArray *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  Texture2D::Texture2D((Texture2D *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  Texture2DArray::Texture2DArray((Texture2DArray *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  Texture3D::Texture3D((Texture3D *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  RVar3 = (ReductionModeParam)operator_new(0x68);
  TextureCube::TextureCube((TextureCube *)RVar3);
  local_38 = (Texture1D *)RVar3;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
  ::emplace_back<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>
            ((vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>
              *)this_01,(SupportedTextureType **)&local_38);
  local_38 = (Texture1D *)0x140600001903;
  local_30 = 1;
  iVar2._M_current =
       (this->m_supportedTextureDataTypes).
       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_supportedTextureDataTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
    ::_M_realloc_insert<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>
              (this_00,iVar2,(SupportedTextureDataType *)&local_38);
  }
  else {
    (iVar2._M_current)->m_testFlags = 1;
    (iVar2._M_current)->m_format = 0x1903;
    (iVar2._M_current)->m_type = 0x1406;
    ppSVar1 = &(this->m_supportedTextureDataTypes).
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_38 = (Texture1D *)0x140100001903;
  local_30 = 1;
  iVar2._M_current =
       (this->m_supportedTextureDataTypes).
       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_supportedTextureDataTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
    ::_M_realloc_insert<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>
              (this_00,iVar2,(SupportedTextureDataType *)&local_38);
  }
  else {
    (iVar2._M_current)->m_testFlags = 1;
    (iVar2._M_current)->m_format = 0x1903;
    (iVar2._M_current)->m_type = 0x1401;
    ppSVar1 = &(this->m_supportedTextureDataTypes).
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_38 = (Texture1D *)0x140600001902;
  local_30 = 0xd;
  iVar2._M_current =
       (this->m_supportedTextureDataTypes).
       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_supportedTextureDataTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
    ::_M_realloc_insert<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>
              (this_00,iVar2,(SupportedTextureDataType *)&local_38);
  }
  else {
    (iVar2._M_current)->m_testFlags = 0xd;
    (iVar2._M_current)->m_format = 0x1902;
    (iVar2._M_current)->m_type = 0x1406;
    ppSVar1 = &(this->m_supportedTextureDataTypes).
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_38 = (Texture1D *)0x140100001902;
  local_30 = 0xd;
  iVar2._M_current =
       (this->m_supportedTextureDataTypes).
       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_supportedTextureDataTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
    ::_M_realloc_insert<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>
              (this_00,iVar2,(SupportedTextureDataType *)&local_38);
  }
  else {
    (iVar2._M_current)->m_testFlags = 0xd;
    (iVar2._M_current)->m_format = 0x1902;
    (iVar2._M_current)->m_type = 0x1401;
    ppSVar1 = &(this->m_supportedTextureDataTypes).
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_38 = (Texture1D *)0x140600001909;
  local_30 = 2;
  iVar2._M_current =
       (this->m_supportedTextureDataTypes).
       super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_supportedTextureDataTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
    ::_M_realloc_insert<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>
              (this_00,iVar2,(SupportedTextureDataType *)&local_38);
  }
  else {
    (iVar2._M_current)->m_testFlags = 2;
    (iVar2._M_current)->m_format = 0x1909;
    (iVar2._M_current)->m_type = 0x1406;
    ppSVar1 = &(this->m_supportedTextureDataTypes).
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

TextureFilterMinmaxUtils::TextureFilterMinmaxUtils()
{
	m_reductionModeParams.push_back(ReductionModeParam(GL_MIN, false));
	m_reductionModeParams.push_back(ReductionModeParam(GL_WEIGHTED_AVERAGE_ARB, false));
	m_reductionModeParams.push_back(ReductionModeParam(GL_MAX, false));

	m_supportedTextureTypes.push_back(new Texture1D());
	m_supportedTextureTypes.push_back(new Texture1DArray());
	m_supportedTextureTypes.push_back(new Texture2D());
	m_supportedTextureTypes.push_back(new Texture2DArray());
	m_supportedTextureTypes.push_back(new Texture3D());
	m_supportedTextureTypes.push_back(new TextureCube());

	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_RED, GL_FLOAT, MINMAX));
	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_RED, GL_UNSIGNED_BYTE, MINMAX));
	m_supportedTextureDataTypes.push_back(
		SupportedTextureDataType(GL_DEPTH_COMPONENT, GL_FLOAT, MINMAX | EXCLUDE_3D | EXCLUDE_CUBE));
	m_supportedTextureDataTypes.push_back(
		SupportedTextureDataType(GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, MINMAX | EXCLUDE_3D | EXCLUDE_CUBE));
	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_LUMINANCE, GL_FLOAT, COMPATIBILITY));
}